

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

TemporalVariableLookupPtr __thiscall
Lodtalk::LocalScope::addArgument(LocalScope *this,Oop symbol,Node *localContext)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pair<std::_Rb_tree_iterator<std::pair<const_Lodtalk::OopRef,_std::shared_ptr<Lodtalk::VariableLookup>_>_>,_bool>
  pVar2;
  TemporalVariableLookupPtr TVar3;
  shared_ptr<Lodtalk::TemporalVariableLookup> variable;
  __shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2> local_68;
  anon_union_8_4_0eb573b0_for_Oop_0 local_50;
  __shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2> local_48;
  bool local_38 [8];
  
  local_50.uintValue = local_50.uintValue & 0xffffffffffffff00;
  std::make_shared<Lodtalk::TemporalVariableLookup,Lodtalk::AST::Node*&,bool>
            ((Node **)&local_68,local_38);
  local_50 = (anon_union_8_4_0eb573b0_for_Oop_0)localContext;
  std::__shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,&local_68);
  pVar2 = std::
          _Rb_tree<Lodtalk::OopRef,std::pair<Lodtalk::OopRef_const,std::shared_ptr<Lodtalk::VariableLookup>>,std::_Select1st<std::pair<Lodtalk::OopRef_const,std::shared_ptr<Lodtalk::VariableLookup>>>,std::less<Lodtalk::OopRef>,std::allocator<std::pair<Lodtalk::OopRef_const,std::shared_ptr<Lodtalk::VariableLookup>>>>
          ::
          _M_emplace_unique<std::pair<Lodtalk::Oop,std::shared_ptr<Lodtalk::TemporalVariableLookup>>>
                    ((_Rb_tree<Lodtalk::OopRef,std::pair<Lodtalk::OopRef_const,std::shared_ptr<Lodtalk::VariableLookup>>,std::_Select1st<std::pair<Lodtalk::OopRef_const,std::shared_ptr<Lodtalk::VariableLookup>>>,std::less<Lodtalk::OopRef>,std::allocator<std::pair<Lodtalk::OopRef_const,std::shared_ptr<Lodtalk::VariableLookup>>>>
                      *)((long)symbol.field_0 + 0x18),
                     (pair<Lodtalk::Oop,_std::shared_ptr<Lodtalk::TemporalVariableLookup>_> *)
                     &local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  _Var1._M_pi = local_68._M_refcount._M_pi;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    (this->super_EvaluationScope)._vptr_EvaluationScope = (_func_int **)0x0;
    (this->super_EvaluationScope).parentScope.
    super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    local_68._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_EvaluationScope)._vptr_EvaluationScope = (_func_int **)local_68._M_ptr;
    (this->super_EvaluationScope).parentScope.
    super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var1._M_pi;
    local_68._M_ptr = (element_type *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  TVar3.super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  TVar3.super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (TemporalVariableLookupPtr)
         TVar3.super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TemporalVariableLookupPtr LocalScope::addArgument(Oop symbol, Node *localContext)
{
	auto variable = std::make_shared<TemporalVariableLookup> (localContext, false);
	if(variables.insert(std::make_pair(symbol, variable)).second)
        return variable;
    return TemporalVariableLookupPtr();
}